

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder_test.cc
# Opt level: O2

int main(void)

{
  uint __line;
  SimpleBuilder *this;
  ComplexBuilder *this_00;
  char *__assertion;
  
  this = (SimpleBuilder *)operator_new(0x10);
  SimpleBuilder::SimpleBuilder(this);
  (**(this->super_Builder)._vptr_Builder)(this);
  if (((this->super_Builder).maze)->level == 10) {
    this_00 = (ComplexBuilder *)operator_new(0x10);
    ComplexBuilder::ComplexBuilder(this_00);
    (**(this_00->super_Builder)._vptr_Builder)(this_00);
    if (((this_00->super_Builder).maze)->level == 100) {
      return 0;
    }
    __assertion = "maze->level == 100";
    __line = 0xe;
  }
  else {
    __assertion = "maze->level == 10";
    __line = 10;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/KlotzAndrew[P]design-patterns-cpp/test/creational/builder_test.cc"
                ,__line,"int main()");
}

Assistant:

int main() {
  Director* director = new Director(new SimpleBuilder);
  Maze* maze = director->getMaze();
  assert(maze->level == 10);

  director = new Director(new ComplexBuilder);
  maze = director->getMaze();
  assert(maze->level == 100);
}